

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_SetTranslucent
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  int iVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  ulong uVar5;
  undefined8 *puVar6;
  char *pcVar7;
  bool bVar8;
  double dVar9;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003d49a2;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d4992:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d49a2:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcb1,
                  "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  puVar6 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar6 == (undefined8 *)0x0) goto LAB_003d48f3;
    pPVar4 = (PClass *)puVar6[1];
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar6)(puVar6);
      puVar6[1] = pPVar4;
    }
    bVar8 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar3 && bVar8) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar3) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar8) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d49a2;
    }
  }
  else {
    if (puVar6 != (undefined8 *)0x0) goto LAB_003d4992;
LAB_003d48f3:
    puVar6 = (undefined8 *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      dVar1 = param[1].field_0.f;
      if (numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003d4935;
        pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003d4935:
          iVar2 = param[2].field_0.i;
          *(byte *)((long)puVar6 + 0x10b) = *(byte *)((long)puVar6 + 0x10b) & 0xfd;
          dVar9 = 1.0;
          if (dVar1 <= 1.0) {
            dVar9 = dVar1;
          }
          puVar6[0x23] = -(ulong)(0.0 < dVar1) & (ulong)dVar9;
          uVar5 = 6;
          if (iVar2 != 0) {
            uVar5 = (ulong)((uint)(iVar2 != 2) * 5 + 2);
          }
          *(FRenderStyle *)(puVar6 + 0x21) = LegacyRenderStyles[uVar5];
          return 0;
        }
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcb3,
                    "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xcb2,
                "int AF_AActor_A_SetTranslucent(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetTranslucent)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT		(alpha);
	PARAM_INT_DEF	(mode);

	mode = mode == 0 ? STYLE_Translucent : mode == 2 ? STYLE_Fuzzy : STYLE_Add;

	self->RenderStyle.Flags &= ~STYLEF_Alpha1;
	self->Alpha = clamp(alpha, 0., 1.);
	self->RenderStyle = ERenderStyle(mode);
	return 0;
}